

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void mxx::print_node_distribution(MPI_Comm comm)

{
  _func_int **pp_Var1;
  iterator __position;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  pointer piVar4;
  pointer ppVar5;
  vector<int,std::allocator<int>> *this;
  ulong uVar6;
  _Base_ptr p_Var7;
  ostream *poVar8;
  char *pcVar9;
  long lVar10;
  pointer ppVar11;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  __i;
  pointer pcVar12;
  long lVar13;
  pointer ppVar14;
  int *piVar15;
  int p;
  int rank;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  proc_distr;
  vector<char,_std::allocator<char>_> all_names_raw;
  int p_len;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_names;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  procs_per_node;
  char p_name [257];
  int local_1fc;
  int local_1f8;
  int local_1f4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_1f0;
  undefined1 local_1d8 [20];
  undefined1 local_1c4 [12];
  pointer local_1b8;
  pointer piStack_1b0;
  pointer piStack_1a8;
  vector<char,_std::allocator<char>_> local_1a0;
  int local_184;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_168;
  char local_138 [264];
  
  MPI_Comm_rank(comm,&local_1f4);
  MPI_Comm_size(comm,&local_1f8);
  MPI_Get_processor_name(local_138,&local_184);
  local_138[local_184] = '\0';
  pp_Var1 = (_func_int **)(local_1d8 + 0x10);
  local_1d8._0_8_ = &PTR__comm_001a58a0;
  local_1c4[4] = false;
  local_1d8._8_8_ = comm;
  MPI_Comm_size(comm,pp_Var1);
  MPI_Comm_rank(local_1d8._8_8_,local_1c4);
  gatherv<char>(&local_1a0,local_138,(long)local_184 + 1,0,(comm *)local_1d8);
  mxx::comm::~comm((comm *)local_1d8);
  if (local_1f4 == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_180,(long)local_1f8,(allocator_type *)local_1d8);
    local_1fc = 0;
    if (local_1a0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_1a0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pcVar9 = local_1a0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar12 = local_1a0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (*pcVar12 == '\0') {
          local_1d8._0_8_ = pp_Var1;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                    ((string *)local_1d8,pcVar9,pcVar12);
          lVar10 = (long)local_1fc;
          local_1fc = local_1fc + 1;
          std::__cxx11::string::operator=
                    ((string *)
                     (local_180.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar10),(string *)local_1d8);
          if ((_func_int **)local_1d8._0_8_ != pp_Var1) {
            operator_delete((void *)local_1d8._0_8_);
          }
          pcVar9 = pcVar12 + 1;
        }
        pcVar12 = pcVar12 + 1;
      } while (pcVar12 !=
               local_1a0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    if (local_1fc != local_1f8) {
      __assert_fail("i == p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/utils.hpp"
                    ,0x5a,"void mxx::print_node_distribution(MPI_Comm)");
    }
    local_168._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_168._M_impl.super__Rb_tree_header._M_header;
    local_168._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_168._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_168._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1fc = 0;
    local_168._M_impl.super__Rb_tree_header._M_header._M_right =
         local_168._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < local_1f8) {
      do {
        this = (vector<int,std::allocator<int>> *)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                             *)&local_168,
                            local_180.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_1fc);
        __position._M_current = *(int **)(this + 8);
        if (__position._M_current == *(int **)(this + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (this,__position,&local_1fc);
        }
        else {
          *__position._M_current = local_1fc;
          *(int **)(this + 8) = __position._M_current + 1;
        }
        local_1fc = local_1fc + 1;
      } while (local_1fc < local_1f8);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::vector(&local_1f0,local_168._M_impl.super__Rb_tree_header._M_node_count,
             (allocator_type *)local_1d8);
    local_1fc = 0;
    if ((_Rb_tree_header *)local_168._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_168._M_impl.super__Rb_tree_header) {
      p_Var7 = local_168._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        p_Var2 = *(_Base_ptr *)(p_Var7 + 2);
        p_Var3 = p_Var7[2]._M_parent;
        if (p_Var2 != p_Var3) {
          uVar6 = (long)p_Var3 - (long)p_Var2 >> 2;
          lVar10 = 0x3f;
          if (uVar6 != 0) {
            for (; uVar6 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var2,p_Var3,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (p_Var2,p_Var3);
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
        ::pair<std::vector<int,_std::allocator<int>_>_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var7 + 1)
                   ,(vector<int,_std::allocator<int>_> *)(p_Var7 + 2));
        ppVar11 = local_1f0.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar10 = (long)local_1fc;
        local_1fc = local_1fc + 1;
        std::__cxx11::string::operator=
                  ((string *)
                   (local_1f0.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar10),(string *)local_1d8);
        piVar4 = ppVar11[lVar10].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ppVar11[lVar10].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start = local_1b8;
        ppVar11[lVar10].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = piStack_1b0;
        ppVar11[lVar10].second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = piStack_1a8;
        local_1b8 = (pointer)0x0;
        piStack_1b0 = (pointer)0x0;
        piStack_1a8 = (pointer)0x0;
        if (piVar4 != (pointer)0x0) {
          operator_delete(piVar4);
        }
        if (local_1b8 != (pointer)0x0) {
          operator_delete(local_1b8);
        }
        if ((_func_int **)local_1d8._0_8_ != pp_Var1) {
          operator_delete((void *)local_1d8._0_8_);
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != &local_168._M_impl.super__Rb_tree_header);
    }
    ppVar5 = local_1f0.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar11 = local_1f0.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_1f0.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1f0.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar13 = (long)local_1f0.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1f0.
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (lVar13 >> 3) * 0x6db6db6db6db6db7;
      lVar10 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                (local_1f0.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_1f0.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar13 < 0x381) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                  (ppVar11,ppVar5);
      }
      else {
        ppVar14 = ppVar11 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                  (ppVar11,ppVar14);
        for (; ppVar14 != ppVar5; ppVar14 = ppVar14 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Val_comp_iter<mxx::print_node_distribution(ompi_communicator_t*)::__0>>
                    (ppVar14);
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"== Node distribution == ",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"== p=",5);
    poVar8 = (ostream *)std::ostream::operator<<(&std::cerr,local_1f8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," processes on ",0xe);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," nodes ==",9);
    std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    ppVar11 = local_1f0.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_1f0.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1f0.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"--  Node: \'",0xb)
        ;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(ppVar11->first)._M_dataplus._M_p,
                            (ppVar11->first)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' (",3);
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"/",1);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
        std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"        Ranks: ",0xf);
        piVar15 = (ppVar11->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        while (piVar15 !=
               (ppVar11->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish) {
          std::ostream::operator<<(&std::cerr,*piVar15);
          piVar15 = piVar15 + 1;
          if (piVar15 !=
              (ppVar11->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,", ",2);
          }
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
        std::ostream::put('p');
        std::ostream::flush();
        ppVar11 = ppVar11 + 1;
      } while (ppVar11 !=
               local_1f0.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~vector(&local_1f0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::~_Rb_tree(&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_180);
  }
  if (local_1a0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (char *)0x0) {
    operator_delete(local_1a0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void print_node_distribution(MPI_Comm comm = MPI_COMM_WORLD)
{
    // get MPI parameters
    int rank;
    int p;
    MPI_Comm_rank(comm, &rank);
    MPI_Comm_size(comm, &p);

    // get local processor name
    char p_name[MPI_MAX_PROCESSOR_NAME+1];
    int p_len;
    MPI_Get_processor_name(p_name, &p_len);
    p_name[p_len] = '\0'; // make string NULL-terminated (if not yet so)

    // gather all processor names to master
    // TODO: use gather with string specialization!
    std::vector<char> all_names_raw = gatherv(p_name,p_len+1, 0,comm);

    if (rank == 0)
    {
        std::vector<std::string> all_names(p);
        // disect the names into a set of strings
        std::vector<char>::iterator str_start = all_names_raw.begin();
        int i = 0;
        for (auto it = all_names_raw.begin(); it != all_names_raw.end(); ++it)
        {
            if (*it == '\0')
            {
                all_names[i++] = std::string(str_start, it);
                str_start = it+1;
            }
        }
        assert(i == p);
        std::map<std::string, std::vector<int> > procs_per_node;
        for (i = 0; i < p; ++i)
        {
            procs_per_node[all_names[i]].push_back(i);
        }
        // create array instead of map, then we can sort by first rank
        std::vector<std::pair<std::string, std::vector<int> > > proc_distr(procs_per_node.size());
        i = 0;
        for (auto it = procs_per_node.begin(); it != procs_per_node.end(); ++it)
        {
            // sort procs on each node
            std::sort(it->second.begin(), it->second.end());
            // put into the vector
            proc_distr[i++] = std::make_pair(it->first, it->second);
        }
        // sort the vector of node names by first rank
        std::sort(proc_distr.begin(), proc_distr.end(),
                  [](const std::pair<std::string, std::vector<int> >& x,
                     const std::pair<std::string, std::vector<int> >& y)
                  { return x.second.front() < y.second.front();});

        // print out the rank distribution
        std::cerr << "== Node distribution == " << std::endl;
        std::cerr << "== p=" << p << " processes on " << proc_distr.size() << " nodes ==" << std::endl;
        for (auto it = proc_distr.begin(); it != proc_distr.end(); ++it)
        {
            std::cerr << "--  Node: '" << it->first << "' (" << it->second.size() << "/" << p << ")" << std::endl;
            std::cerr << "        Ranks: ";
            for (auto rank_it = it->second.begin(); rank_it != it->second.end(); ++rank_it)
            {
                std::cerr << *rank_it;
                if (rank_it+1 != it->second.end())
                    std::cerr << ", ";
            }
            std::cerr << std::endl;
        }
    }
}